

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::Detail::anon_unknown_3::FileStream::FileStream(FileStream *this,string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ReusableStringStream *pRVar3;
  char local_59;
  ReusableStringStream local_58;
  string local_48;
  string *local_18;
  string *filename_local;
  FileStream *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  IStream::IStream(&this->super_IStream);
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__FileStream_00503768;
  std::ofstream::ofstream(&this->m_ofs);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&this->m_ofs,_Var2);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::ostream::operator<<(&this->m_ofs,std::unitbuf);
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_58);
  pRVar3 = ReusableStringStream::operator<<(&local_58,(char (*) [23])"Unable to open file: \'");
  pRVar3 = ReusableStringStream::operator<<(pRVar3,local_18);
  local_59 = '\'';
  pRVar3 = ReusableStringStream::operator<<(pRVar3,&local_59);
  ReusableStringStream::str_abi_cxx11_(&local_48,pRVar3);
  throw_domain_error(&local_48);
}

Assistant:

FileStream( std::string const& filename ) {
                m_ofs.open( filename.c_str() );
                CATCH_ENFORCE( !m_ofs.fail(), "Unable to open file: '" << filename << '\'' );
                m_ofs << std::unitbuf;
            }